

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O0

void __thiscall Chip8::Graphics::refresh(Graphics *this)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  int local_24;
  int local_20;
  SDL_Rect scaled_pixel;
  int pixel;
  Graphics *this_local;
  
  unique0x1000013b = this;
  iVar1 = SDL_RenderClear(this->_renderer);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[graphics] clear error: ");
    pcVar3 = (char *)SDL_GetError();
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  for (scaled_pixel.w = 0; scaled_pixel.w < 0x800; scaled_pixel.w = scaled_pixel.w + 1) {
    local_24 = (scaled_pixel.w % 0x40) * 10;
    local_20 = (scaled_pixel.w / 0x40) * 10;
    scaled_pixel.x = 10;
    scaled_pixel.y = 10;
    if ((this->_gfx[scaled_pixel.w] & 1U) == 0) {
      SDL_SetRenderDrawColor(this->_renderer,0,0,0,0xff);
    }
    else {
      SDL_SetRenderDrawColor(this->_renderer,0xff,0xff,0xff);
    }
    SDL_RenderFillRect(this->_renderer,&local_24);
  }
  this->_dirty_buffer = false;
  SDL_RenderPresent(this->_renderer);
  return;
}

Assistant:

void Graphics::refresh() {
        if (SDL_RenderClear(_renderer) != 0) {
            std::cout << "[graphics] clear error: " << SDL_GetError() << std::endl;
        }

        for (int pixel = 0; pixel < kGraphicsWidth * kGraphicsHeight; pixel++) {

            SDL_Rect scaled_pixel = {
                (pixel % kGraphicsWidth) * kGraphicsScale,
                (pixel / kGraphicsWidth) * kGraphicsScale,
                kGraphicsScale,
                kGraphicsScale
            };

            if (_gfx[pixel]) {
                SDL_SetRenderDrawColor(_renderer, 255, 255, 255, 255);
            } else {
                SDL_SetRenderDrawColor(_renderer, 0, 0, 0, 255);
            }

            SDL_RenderFillRect(_renderer, &scaled_pixel);
        }

        _dirty_buffer = false;

        SDL_RenderPresent(_renderer);
    }